

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segmentation.cpp
# Opt level: O2

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* pobr::imgProcessing::utils::segmentation::getImageSegmentsScanMerge
            (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *__return_storage_ptr__,Mat *img,bool *useDiagonalDetection)

{
  int iVar1;
  int iVar2;
  Segment *this;
  pointer prVar3;
  pointer pSVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  reference pvVar8;
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  __node_base *p_Var9;
  pointer prVar10;
  ulong __n;
  Segment *segment;
  pointer pSVar11;
  __node_base *p_Var12;
  undefined1 auVar13 [16];
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  segmentsRefs;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  segmentsBoundaries;
  unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
  uniqSegments;
  Segment *segmentPtr;
  double lookupKernelValues [9];
  unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
  touchingSegments;
  Mat lookupKernel;
  Mat segmentsIDs;
  matrixOps local_90 [96];
  
  iVar1 = *(int *)(img + 8);
  iVar2 = *(int *)(img + 0xc);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&lookupKernel,0.0);
  cv::Mat::Mat(&segmentsIDs,iVar1,iVar2,6,(Scalar_ *)&lookupKernel);
  segmentsBoundaries.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  segmentsBoundaries.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  segmentsBoundaries.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  touchingSegments._M_h._M_buckets = &touchingSegments._M_h._M_single_bucket;
  touchingSegments._M_h._M_bucket_count = 1;
  touchingSegments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  touchingSegments._M_h._M_element_count = 0;
  touchingSegments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  touchingSegments._M_h._M_rehash_policy._M_next_resize = 0;
  touchingSegments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lookupKernelValues[0] = 0.0;
  lookupKernelValues[2] = 0.0;
  lookupKernelValues[4] = 0.0;
  lookupKernelValues[8] = 0.0;
  lookupKernelValues[6] = 0.0;
  lookupKernelValues[1] = 1.0;
  lookupKernelValues[3] = 1.0;
  lookupKernelValues[5] = 1.0;
  lookupKernelValues[7] = 1.0;
  if (*useDiagonalDetection == true) {
    lookupKernelValues[0] = 1.0;
    lookupKernelValues[2] = 1.0;
    lookupKernelValues[6] = 1.0;
    lookupKernelValues[8] = 1.0;
  }
  cv::Mat::Mat(&lookupKernel,3,3,6,lookupKernelValues,0);
  uniqSegments._M_h._M_element_count =
       (size_type)
       std::
       _Function_handler<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/segmentation.cpp:53:9)>
       ::_M_invoke;
  uniqSegments._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/segmentation.cpp:53:9)>
       ::_M_manager;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniqSegments._M_h._M_buckets = (__buckets_ptr)img;
  uniqSegments._M_h._M_bucket_count = (size_type)&touchingSegments;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  (segmentsRefs.
   super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_data = (Segment *)img;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1]._M_data = (Segment *)&segmentsBoundaries;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2]._M_data = (Segment *)&segmentsIDs;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3]._M_data = (Segment *)&touchingSegments;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_double_&,_const_cv::Mat_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/segmentation.cpp:78:9)>
                ::_M_manager;
  matrixOps::applyKernel<double,double,double>
            (local_90,&segmentsIDs,&lookupKernel,0.0,
             (function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&)>
              *)&uniqSegments,
             (function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_double_&,_const_cv::Mat_&)>
              *)&segmentsRefs);
  cv::Mat::~Mat((Mat *)local_90);
  std::_Function_base::~_Function_base((_Function_base *)&segmentsRefs);
  std::_Function_base::~_Function_base((_Function_base *)&uniqSegments);
  pSVar4 = segmentsBoundaries.
           super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  segmentsRefs.
  super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pSVar11 = segmentsBoundaries.
                 super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar11 != pSVar4; pSVar11 = pSVar11 + 1
      ) {
    uniqSegments._M_h._M_buckets = (__buckets_ptr)pSVar11;
    std::
    vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>>>
    ::emplace_back<std::reference_wrapper<pobr::imgProcessing::structs::Segment>>
              ((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>>>
                *)&segmentsRefs,
               (reference_wrapper<pobr::imgProcessing::structs::Segment> *)&uniqSegments);
  }
  __n = 0;
  while( true ) {
    prVar3 = segmentsRefs.
             super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)segmentsRefs.
                      super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)segmentsRefs.
                      super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
    pvVar5 = std::
             vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
             ::at(&segmentsRefs,__n);
    this = pvVar5->_M_data;
    __n = __n + 1;
    auVar13._8_4_ = (int)(__n >> 0x20);
    auVar13._0_8_ = __n;
    auVar13._12_4_ = 0x45300000;
    uniqSegments._M_h._M_buckets =
         (__buckets_ptr)
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0));
    pmVar6 = std::__detail::
             _Map_base<double,_std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<double,_std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&touchingSegments,(key_type *)&uniqSegments);
    p_Var9 = &(pmVar6->_M_h)._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      uVar7 = (ulong)((double)p_Var9[1]._M_nxt + -1.0);
      pvVar8 = std::
               vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
               ::at(&segmentsRefs,
                    (long)(((double)p_Var9[1]._M_nxt + -1.0) - 9.223372036854776e+18) &
                    (long)uVar7 >> 0x3f | uVar7);
      structs::Segment::merge(this,pvVar8->_M_data);
      uVar7 = (ulong)((double)p_Var9[1]._M_nxt + -1.0);
      pvVar8 = std::
               vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
               ::at(&segmentsRefs,
                    (long)(((double)p_Var9[1]._M_nxt + -1.0) - 9.223372036854776e+18) &
                    (long)uVar7 >> 0x3f | uVar7);
      pvVar8->_M_data = pvVar5->_M_data;
    }
  }
  uniqSegments._M_h._M_buckets = &uniqSegments._M_h._M_single_bucket;
  uniqSegments._M_h._M_bucket_count = 1;
  p_Var12 = &uniqSegments._M_h._M_before_begin;
  uniqSegments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqSegments._M_h._M_element_count = 0;
  uniqSegments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqSegments._M_h._M_rehash_policy._M_next_resize = 0;
  uniqSegments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (prVar10 = segmentsRefs.
                 super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; prVar10 != prVar3; prVar10 = prVar10 + 1
      ) {
    segmentPtr = prVar10->_M_data;
    std::__detail::
    _Insert_base<pobr::imgProcessing::structs::Segment_*,_pobr::imgProcessing::structs::Segment_*,_std::allocator<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Identity,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<pobr::imgProcessing::structs::Segment_*,_pobr::imgProcessing::structs::Segment_*,_std::allocator<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Identity,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&uniqSegments,&segmentPtr);
  }
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
    std::
    vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    ::push_back(__return_storage_ptr__,(value_type *)p_Var12[1]._M_nxt);
  }
  std::
  _Hashtable<pobr::imgProcessing::structs::Segment_*,_pobr::imgProcessing::structs::Segment_*,_std::allocator<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Identity,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&uniqSegments._M_h);
  std::
  _Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  ::~_Vector_base(&segmentsRefs.
                   super__Vector_base<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
                 );
  cv::Mat::~Mat(&lookupKernel);
  std::
  _Hashtable<double,_std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&touchingSegments._M_h);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&segmentsBoundaries);
  cv::Mat::~Mat(&segmentsIDs);
  return __return_storage_ptr__;
}

Assistant:

std::vector<structs::Segment>
segmentation::getImageSegmentsScanMerge(const cv::Mat& img, const bool& useDiagonalDetection)
{
    auto segmentsIDs = cv::Mat(
        img.rows,
        img.cols,
        CV_64F,
        0.0
    );
    std::vector<structs::Segment> segmentsBoundaries;
    std::unordered_map<double, std::unordered_set<double>> touchingSegments;

    double lookupKernelValues[9] = {
        0, 1, 0,
        1, 0, 1,
        0, 1, 0     
    };

    if (useDiagonalDetection) {
        lookupKernelValues[0] = 1;
        lookupKernelValues[2] = 1;
        lookupKernelValues[6] = 1;
        lookupKernelValues[8] = 1;
    }

    auto lookupKernel = cv::Mat(
        3,
        3,
        CV_64F,
        lookupKernelValues
    );

    // Note: Kernel application skips img edges
    //       replace with forEachPixel maybe?
    matrixOps::applyKernel<double, double, double>(
        segmentsIDs,
        lookupKernel,
        0,
        [&](const uint64_t& x, const uint64_t& y, double& accumulator, const double& segmentID, const double& kernelValue) -> double
        {
            const auto& imgPixel = img.at<cv::Vec3b>(y, x);

            if (imgPixel[0] == consts::colors::black) {
                // Short-circuit as there is nothing to do here
                return 0;
            }

            if (kernelValue == 0) {
                return accumulator;
            }

            if (accumulator != 0) {
                if (segmentID == 0 || accumulator == segmentID) {
                    return accumulator;
                }

                // Segments touching, store that information for merging phase
                touchingSegments.at(accumulator).insert(segmentID);
                touchingSegments.at(segmentID).insert(accumulator);
            }

            return segmentID;
        },
        [&](const uint64_t& x, const uint64_t& y, double& accumulator, double& setSegmentID, const cv::Mat& tt) -> void
        {
            const auto& imgPixel = img.at<cv::Vec3b>(y, x);

            if (imgPixel[0] == consts::colors::black) {
                // Short-circuit as there is nothing to do here
                return;
            }

            if (accumulator == 0) {
                // Not IDed yet, create new segment

                const auto thisSegmentID = segmentsBoundaries.size() + 1;
                structs::Segment newSegment;

                newSegment.xMin = x;
                newSegment.xMax = x;
                newSegment.yMin = y;
                newSegment.yMax = y;

                segmentsIDs.at<double>(y, x) = thisSegmentID;
                segmentsBoundaries.push_back(newSegment);
                touchingSegments.insert({ thisSegmentID, {} });
            } else {
                // Segment exists, update boundaries

                const auto thisSegmentID = accumulator;
                auto& thisSegment = segmentsBoundaries.at(thisSegmentID - 1);

                segmentsIDs.at<double>(y, x) = thisSegmentID;
                thisSegment.updateBoundaries(x, y);
            }
        }
    );

    // Merge touching segments
    std::vector<std::reference_wrapper<structs::Segment>> segmentsRefs;

    for (auto& segment: segmentsBoundaries) {
        segmentsRefs.push_back(std::ref(segment));
    }

    for (uint64_t segmentIdx = 0; segmentIdx < segmentsRefs.size(); segmentIdx++) {
        const auto& segmentRef = segmentsRefs.at(segmentIdx);
        auto& segment = segmentRef.get();
        const auto& touching = touchingSegments.at(segmentIdx + 1);

        for (const auto& touchesIdx: touching) {
            const auto& touched = segmentsRefs.at(touchesIdx - 1);

            segment.merge(touched);
            segmentsRefs.at(touchesIdx - 1) = segmentRef;
        }
    }

    std::unordered_set<structs::Segment*> uniqSegments;
    for (const auto& segment: segmentsRefs) {
        structs::Segment* segmentPtr = &(segment.get());

        uniqSegments.insert(segmentPtr);
    }

    std::vector<structs::Segment> segments;
    for (const auto& segmentPtr: uniqSegments) {
        segments.push_back((*segmentPtr));
    }

    // Note: does not update Segment's pixels

    return segments;
}